

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O0

void on_message_sender_state_changed_callback
               (void *context,MESSAGE_SENDER_STATE new_state,MESSAGE_SENDER_STATE previous_state)

{
  LOGGER_LOG p_Var1;
  time_t tVar2;
  AMQP_MESSENGER_INSTANCE_conflict *instance;
  LOGGER_LOG l;
  MESSAGE_SENDER_STATE previous_state_local;
  MESSAGE_SENDER_STATE new_state_local;
  void *context_local;
  
  if (context == (void *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"on_message_sender_state_changed_callback",0x272,1,
                "on_message_sender_state_changed_callback was invoked with a NULL context; although unexpected, this failure will be ignored"
               );
    }
  }
  else if (new_state != previous_state) {
    *(MESSAGE_SENDER_STATE *)((long)context + 0x48) = new_state;
    *(MESSAGE_SENDER_STATE *)((long)context + 0x4c) = previous_state;
    tVar2 = get_time((time_t *)0x0);
    *(time_t *)((long)context + 0x78) = tVar2;
  }
  return;
}

Assistant:

static void on_message_sender_state_changed_callback(void* context, MESSAGE_SENDER_STATE new_state, MESSAGE_SENDER_STATE previous_state)
{
    if (context == NULL)
    {
        LogError("on_message_sender_state_changed_callback was invoked with a NULL context; although unexpected, this failure will be ignored");
    }
    else if (new_state != previous_state)
    {
        AMQP_MESSENGER_INSTANCE* instance = (AMQP_MESSENGER_INSTANCE*)context;

        instance->message_sender_current_state = new_state;
        instance->message_sender_previous_state = previous_state;
        instance->last_message_sender_state_change_time = get_time(NULL);
    }
}